

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testUTF8.cxx
# Opt level: O0

bool decode_bad(char *s)

{
  char *pcVar1;
  char *e;
  char *pcStack_18;
  uint uc;
  char *s_local;
  
  e._4_4_ = 0xffff;
  pcStack_18 = s;
  pcVar1 = cm_utf8_decode_character(s,s + 4,(uint *)((long)&e + 4));
  if (pcVar1 == (char *)0x0) {
    report_bad(true,pcStack_18);
    printf("failed as expected\n");
  }
  else {
    report_bad(false,pcStack_18);
    printf("expected failure, got 0x%04X\n",(ulong)e._4_4_);
  }
  return pcVar1 == (char *)0x0;
}

Assistant:

static bool decode_bad(test_utf8_char const s)
{
  unsigned int uc = 0xFFFFu;
  const char* e = cm_utf8_decode_character(s, s + 4, &uc);
  if (e) {
    report_bad(false, s);
    printf("expected failure, got 0x%04X\n", uc);
    return false;
  }
  report_bad(true, s);
  printf("failed as expected\n");
  return true;
}